

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_setup_obmc_dst_bufs(MACROBLOCKD *xd,uint8_t **dst_buf1,uint8_t **dst_buf2)

{
  int iVar1;
  ulong *in_RDX;
  ulong *in_RSI;
  MACROBLOCKD *in_RDI;
  int len;
  
  iVar1 = is_cur_buf_hbd(in_RDI);
  if (iVar1 == 0) {
    *in_RSI = (ulong)in_RDI->tmp_obmc_bufs[0];
    in_RSI[1] = (ulong)(in_RDI->tmp_obmc_bufs[0] + 0x4000);
    in_RSI[2] = (ulong)(in_RDI->tmp_obmc_bufs[0] + 0x8000);
    *in_RDX = (ulong)in_RDI->tmp_obmc_bufs[1];
    in_RDX[1] = (ulong)(in_RDI->tmp_obmc_bufs[1] + 0x4000);
    in_RDX[2] = (ulong)(in_RDI->tmp_obmc_bufs[1] + 0x8000);
  }
  else {
    *in_RSI = (ulong)in_RDI->tmp_obmc_bufs[0] >> 1;
    in_RSI[1] = (ulong)(in_RDI->tmp_obmc_bufs[0] + 0x8000) >> 1;
    in_RSI[2] = (ulong)(in_RDI->tmp_obmc_bufs[0] + 0x10000) >> 1;
    *in_RDX = (ulong)in_RDI->tmp_obmc_bufs[1] >> 1;
    in_RDX[1] = (ulong)(in_RDI->tmp_obmc_bufs[1] + 0x8000) >> 1;
    in_RDX[2] = (ulong)(in_RDI->tmp_obmc_bufs[1] + 0x10000) >> 1;
  }
  return;
}

Assistant:

void av1_setup_obmc_dst_bufs(MACROBLOCKD *xd, uint8_t **dst_buf1,
                             uint8_t **dst_buf2) {
  if (is_cur_buf_hbd(xd)) {
    int len = sizeof(uint16_t);
    dst_buf1[0] = CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[0]);
    dst_buf1[1] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE * len);
    dst_buf1[2] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE * 2 * len);
    dst_buf2[0] = CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[1]);
    dst_buf2[1] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE * len);
    dst_buf2[2] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE * 2 * len);
  } else {
    dst_buf1[0] = xd->tmp_obmc_bufs[0];
    dst_buf1[1] = xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE;
    dst_buf1[2] = xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE * 2;
    dst_buf2[0] = xd->tmp_obmc_bufs[1];
    dst_buf2[1] = xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE;
    dst_buf2[2] = xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE * 2;
  }
}